

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double spmpar(int *i)

{
  int iVar1;
  int *i_local;
  
  if (*i < 2) {
    iVar1 = ipmpar(&spmpar::K1);
    spmpar::b = (double)iVar1;
    spmpar::m = ipmpar(&spmpar::K2);
    i_local = (int *)pow(spmpar::b,(double)(1 - spmpar::m));
  }
  else if (*i < 3) {
    iVar1 = ipmpar(&spmpar::K1);
    spmpar::b = (double)iVar1;
    spmpar::emin = ipmpar(&spmpar::K3);
    spmpar::one = 1.0;
    spmpar::binv = 1.0 / spmpar::b;
    spmpar::w = pow(spmpar::b,(double)(spmpar::emin + 2));
    i_local = (int *)(spmpar::w * spmpar::binv * spmpar::binv * spmpar::binv);
  }
  else {
    spmpar::ibeta = ipmpar(&spmpar::K1);
    spmpar::m = ipmpar(&spmpar::K2);
    spmpar::emax = ipmpar(&spmpar::K4);
    spmpar::b = (double)spmpar::ibeta;
    spmpar::bm1 = (double)(spmpar::ibeta + -1);
    spmpar::one = 1.0;
    spmpar::z = pow(spmpar::b,(double)(spmpar::m + -1));
    spmpar::w = ((spmpar::z - spmpar::one) * spmpar::b + spmpar::bm1) / (spmpar::b * spmpar::z);
    spmpar::z = pow(spmpar::b,(double)(spmpar::emax + -2));
    i_local = (int *)(spmpar::w * spmpar::z * spmpar::b * spmpar::b);
  }
  spmpar::spmpar = (double)i_local;
  return (double)i_local;
}

Assistant:

double spmpar(int *i)
/*
-----------------------------------------------------------------------

     SPMPAR PROVIDES THE SINGLE PRECISION MACHINE CONSTANTS FOR
     THE COMPUTER BEING USED. IT IS ASSUMED THAT THE ARGUMENT
     I IS AN INTEGER HAVING ONE OF THE VALUES 1, 2, OR 3. IF THE
     SINGLE PRECISION ARITHMETIC BEING USED HAS M BASE B DIGITS AND
     ITS SMALLEST AND LARGEST EXPONENTS ARE EMIN AND EMAX, THEN

        SPMPAR(1) = B**(1 - M), THE MACHINE PRECISION,

        SPMPAR(2) = B**(EMIN - 1), THE SMALLEST MAGNITUDE,

        SPMPAR(3) = B**EMAX*(1 - B**(-M)), THE LARGEST MAGNITUDE.

-----------------------------------------------------------------------
     WRITTEN BY
        ALFRED H. MORRIS, JR.
        NAVAL SURFACE WARFARE CENTER
        DAHLGREN VIRGINIA
-----------------------------------------------------------------------
-----------------------------------------------------------------------
     MODIFIED BY BARRY W. BROWN TO RETURN DOUBLE PRECISION MACHINE
     CONSTANTS FOR THE COMPUTER BEING USED.  THIS MODIFICATION WAS
     MADE AS PART OF CONVERTING BRATIO TO DOUBLE PRECISION
-----------------------------------------------------------------------
*/
{
static int K1 = 4;
static int K2 = 8;
static int K3 = 9;
static int K4 = 10;
static double spmpar,b,binv,bm1,one,w,z;
static int emax,emin,ibeta,m;
/*
     ..
     .. Executable Statements ..
*/
    if(*i > 1) goto S10;
    b = ipmpar(&K1);
    m = ipmpar(&K2);
    spmpar = pow(b,(double)(1-m));
    return spmpar;
S10:
    if(*i > 2) goto S20;
    b = ipmpar(&K1);
    emin = ipmpar(&K3);
    one = 1.0;
    binv = one/b;
    w = pow(b,(double)(emin+2));
    spmpar = w*binv*binv*binv;
    return spmpar;
S20:
    ibeta = ipmpar(&K1);
    m = ipmpar(&K2);
    emax = ipmpar(&K4);
    b = ibeta;
    bm1 = ibeta-1;
    one = 1.0;
    z = pow(b,(double)(m-1));
    w = ((z-one)*b+bm1)/(b*z);
    z = pow(b,(double)(emax-2));
    spmpar = w*z*b*b;
    return spmpar;
}